

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

optional<QHttpHeaders::WellKnownHeader> HeaderName::toWellKnownHeader(QByteArrayView name)

{
  QOffsetStringArray<std::array<char,_2515UL>,_std::array<unsigned_short,_178UL>_> *this;
  QByteArrayView *this_00;
  QByteArrayView *data;
  long in_FS_OFFSET;
  uchar *result;
  uchar *indexesEnd;
  uchar *indexesBegin;
  QByteArrayView *in_stack_ffffffffffffff98;
  undefined5 in_stack_ffffffffffffffa0;
  undefined1 uVar1;
  undefined2 in_stack_ffffffffffffffa6;
  undefined8 in_stack_ffffffffffffffc8;
  int index;
  undefined1 local_20 [16];
  _Optional_payload_base<QHttpHeaders::WellKnownHeader> local_10;
  long local_8;
  
  index = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QOffsetStringArray<std::array<char,_2515UL>,_std::array<unsigned_short,_178UL>_> *)
         std::cbegin<unsigned_char[177]>((uchar (*) [177])0x1d1cfc);
  this_00 = (QByteArrayView *)std::cend<unsigned_char[177]>((uchar (*) [177])0x1d1d0d);
  data = (QByteArrayView *)
         std::
         lower_bound<unsigned_char_const*,QByteArrayView,(anonymous_namespace)::ByIndirectHeaderName>
                   (this,this_00,local_20);
  uVar1 = false;
  if (data != this_00) {
    QOffsetStringArray<std::array<char,_2515UL>,_std::array<unsigned_short,_178UL>_>::operator[]
              (this,index);
    QByteArrayView::QByteArrayView<const_char_*,_true>(this_00,(char **)data);
    uVar1 = ::operator==((QByteArrayView *)
                         CONCAT26(in_stack_ffffffffffffffa6,
                                  CONCAT15(uVar1,in_stack_ffffffffffffffa0)),
                         in_stack_ffffffffffffff98);
  }
  if ((bool)uVar1 == false) {
    std::optional<QHttpHeaders::WellKnownHeader>::optional
              ((optional<QHttpHeaders::WellKnownHeader> *)&local_10);
  }
  else {
    std::optional<QHttpHeaders::WellKnownHeader>::optional<QHttpHeaders::WellKnownHeader,_true>
              ((optional<QHttpHeaders::WellKnownHeader> *)
               CONCAT26(in_stack_ffffffffffffffa6,CONCAT15(uVar1,in_stack_ffffffffffffffa0)),
               (WellKnownHeader *)in_stack_ffffffffffffff98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (optional<QHttpHeaders::WellKnownHeader>)local_10;
  }
  __stack_chk_fail();
}

Assistant:

static std::optional<QHttpHeaders::WellKnownHeader> toWellKnownHeader(QByteArrayView name) noexcept
    {
        auto indexesBegin = std::cbegin(orderedHeaderNameIndexes);
        auto indexesEnd = std::cend(orderedHeaderNameIndexes);

        auto result = std::lower_bound(indexesBegin, indexesEnd, name, ByIndirectHeaderName{});

        if (result != indexesEnd && name == headerNames[*result])
            return static_cast<QHttpHeaders::WellKnownHeader>(*result);
        return std::nullopt;
    }